

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblackoilanalysis.cpp
# Opt level: O1

void TPZBlackOilAnalysis::Flow
               (TPZBlackOilAnalysis *an,int matid,double *WaterFlowSC,double *OilFlowSC,
               double *WaterFlowBottom,double *OilFlowBottom)

{
  double dVar1;
  TPZCompMesh *mesh;
  int64_t iVar2;
  TPZCompEl *pTVar3;
  int iVar4;
  TPZFMatrix<double> *pTVar5;
  TPZCompEl **ppTVar6;
  long *plVar7;
  TPZGeoEl *pTVar8;
  TPZGeoEl *pTVar9;
  undefined8 uVar10;
  TPZBlackOil2P3D *this;
  uint uVar11;
  ulong nelem;
  STATE SVar12;
  TPZVec<double> sol;
  TPZVec<double> qsi;
  BFadREAL Bo;
  TPZElementMatrixT<double> ef;
  TPZElementMatrixT<double> ek;
  TPZVec<double> local_8750;
  TPZVec<double> local_8730;
  BFadREAL local_8710;
  BFadREAL local_86e0;
  TPZElementMatrixT<double> local_86b0;
  TPZElementMatrixT<double> local_4370;
  
  pTVar5 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                     (&(an->super_TPZNonLinearAnalysis).super_TPZLinearAnalysis.super_TPZAnalysis.
                       fSolution);
  (*(an->super_TPZNonLinearAnalysis).super_TPZLinearAnalysis.super_TPZAnalysis.super_TPZSavable.
    _vptr_TPZSavable[0xd])(an,pTVar5);
  mesh = (an->super_TPZNonLinearAnalysis).super_TPZLinearAnalysis.super_TPZAnalysis.fCompMesh;
  TPZVec<double>::TPZVec(&local_8730,3);
  TPZVec<double>::TPZVec(&local_8750,1);
  TPZElementMatrixT<double>::TPZElementMatrixT(&local_4370,mesh,EK);
  TPZElementMatrixT<double>::TPZElementMatrixT(&local_86b0,mesh,EF);
  iVar2 = (mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  *WaterFlowSC = 0.0;
  *OilFlowSC = 0.0;
  *WaterFlowBottom = 0.0;
  *OilFlowBottom = 0.0;
  uVar11 = (uint)iVar2;
  if (0 < (int)uVar11) {
    nelem = 0;
    do {
      ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      pTVar3 = *ppTVar6;
      if (pTVar3 != (TPZCompEl *)0x0) {
        plVar7 = (long *)(**(code **)(*(long *)pTVar3 + 0xb8))(pTVar3);
        iVar4 = (**(code **)(*plVar7 + 0x58))(plVar7);
        if (iVar4 == matid) {
          plVar7 = (long *)__dynamic_cast(pTVar3,&TPZCompEl::typeinfo,&TPZInterfaceElement::typeinfo
                                          ,0);
          if (plVar7 != (long *)0x0) {
            (**(code **)(*plVar7 + 0x108))(plVar7,&local_4370,&local_86b0);
            pTVar8 = TPZCompEl::Reference((TPZCompEl *)plVar7[5]);
            pTVar9 = TPZCompEl::Reference((TPZCompEl *)plVar7[5]);
            iVar4 = (**(code **)(*(long *)pTVar9 + 0xf0))(pTVar9);
            (**(code **)(*(long *)pTVar8 + 0x260))(pTVar8,iVar4 + -1,&local_8730);
            (**(code **)(*(long *)plVar7[5] + 0x1b0))((long *)plVar7[5],&local_8730,2,&local_8750);
            dVar1 = *local_8750.fStore;
            local_86e0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01901a98;
            local_86e0.dx_[1] = 0.0;
            local_86e0.dx_[2] = 0.0;
            local_86e0.val_ = 0.0;
            local_86e0.dx_[0] = 0.0;
            local_86e0.dx_[3] = 0.0;
            uVar10 = (**(code **)(*plVar7 + 0xb8))(plVar7);
            plVar7 = (long *)__dynamic_cast(uVar10,&TPZMaterial::typeinfo,
                                            &TPZBndCondT<double>::typeinfo,0xfffffffffffffffe);
            uVar10 = (**(code **)(*plVar7 + 0x50))(plVar7);
            this = (TPZBlackOil2P3D *)
                   __dynamic_cast(uVar10,&TPZMaterial::typeinfo,&TPZBlackOil2P3D::typeinfo,0);
            local_8710.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01901a98;
            local_8710.dx_[0] = 1.0;
            local_8710.dx_[1] = 0.0;
            local_8710.dx_[2] = 0.0;
            local_8710.dx_[3] = 0.0;
            local_8710.val_ = dVar1;
            TPZBlackOil2P3D::Bo(this,&local_8710,&local_86e0);
            local_8710.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01901a98;
            if ((local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                 super_TPZBaseMatrix.fRow < 1) ||
               (local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                .fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *OilFlowSC = *local_86b0.fMat.super_TPZFMatrix<double>.fElem * 86400.0 + *OilFlowSC;
            if ((local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                 super_TPZBaseMatrix.fRow < 2) ||
               (local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                .fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *WaterFlowSC = local_86b0.fMat.super_TPZFMatrix<double>.fElem[1] * 86400.0 +
                           *WaterFlowSC;
            if ((local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                 super_TPZBaseMatrix.fRow < 1) ||
               (local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                .fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *OilFlowBottom =
                 *local_86b0.fMat.super_TPZFMatrix<double>.fElem * local_86e0.val_ * 86400.0 +
                 *OilFlowBottom;
            if ((local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                 super_TPZBaseMatrix.fRow < 2) ||
               (local_86b0.fMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                .fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dVar1 = local_86b0.fMat.super_TPZFMatrix<double>.fElem[1];
            SVar12 = TPZBlackOil2P3D::Bw(this);
            *WaterFlowBottom = dVar1 * SVar12 * 86400.0 + *WaterFlowBottom;
          }
        }
      }
      nelem = nelem + 1;
    } while ((uVar11 & 0x7fffffff) != nelem);
  }
  local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d7b0;
  TPZBlock::~TPZBlock(&local_86b0.fConstrBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_86b0.fConstrMat.super_TPZFMatrix<double>,&PTR_PTR_01884558)
  ;
  TPZBlock::~TPZBlock(&local_86b0.fBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_86b0.fMat.super_TPZFMatrix<double>,&PTR_PTR_01884558);
  TPZElementMatrix::~TPZElementMatrix(&local_86b0.super_TPZElementMatrix);
  local_4370.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d7b0;
  TPZBlock::~TPZBlock(&local_4370.fConstrBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_4370.fConstrMat.super_TPZFMatrix<double>,&PTR_PTR_01884558)
  ;
  TPZBlock::~TPZBlock(&local_4370.fBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_4370.fMat.super_TPZFMatrix<double>,&PTR_PTR_01884558);
  TPZElementMatrix::~TPZElementMatrix(&local_4370.super_TPZElementMatrix);
  local_8750._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_8750.fStore != (double *)0x0) {
    operator_delete__(local_8750.fStore);
  }
  local_8730._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_8730.fStore != (double *)0x0) {
    operator_delete__(local_8730.fStore);
  }
  return;
}

Assistant:

void TPZBlackOilAnalysis::Flow(TPZBlackOilAnalysis &an, int matid, double & WaterFlowSC, double  & OilFlowSC, double & WaterFlowBottom, double  & OilFlowBottom){
	
	an.LoadSolution(an.Solution());
	TPZCompMesh * cmesh = an.Mesh();
	TPZVec<REAL> qsi(3);
    TPZVec<STATE> sol(1);
	
	TPZElementMatrixT<STATE> ek(cmesh, TPZElementMatrix::EK), ef(cmesh, TPZElementMatrix::EF);
	const int nel = cmesh->NElements();
	WaterFlowSC = 0.;
	OilFlowSC = 0.;
	WaterFlowBottom = 0.;
	OilFlowBottom = 0.;
	for(int iel = 0; iel < nel; iel++){
		TPZCompEl * cel = cmesh->ElementVec()[iel];
		if(!cel) continue;
		if(cel->Material()->Id() != matid) continue;
		TPZInterfaceElement * face = dynamic_cast<TPZInterfaceElement*>(cel);
		if(!face) continue;
		face->CalcStiff(ek, ef);
		
		face->LeftElement()->Reference()->CenterPoint(face->LeftElement()->Reference()->NSides()-1,qsi);
		face->LeftElement()->Solution(qsi, TPZBlackOil2P3D::EOilPressure, sol);
		
		TPZBlackOil2P3D::BFadREAL po(sol[0],0);
		TPZBlackOil2P3D::BFadREAL Bo;
		
		auto * bc =
			dynamic_cast<TPZBndCondT<STATE>*> (face->Material());
		auto * bo =
			dynamic_cast<TPZBlackOil2P3D *> (bc->Material());
		bo->Bo(po, Bo);
		
		OilFlowSC += ef.fMat(0,0)*86400.;
		WaterFlowSC += ef.fMat(1,0)*86400.;
		
		OilFlowBottom += ef.fMat(0,0)*Bo.val()*86400.;
		WaterFlowBottom += ef.fMat(1,0)*bo->Bw()*86400.;
	}//iel
}